

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  ushort uVar63;
  undefined1 auVar64 [15];
  ushort uVar65;
  undefined1 auVar66 [15];
  ushort uVar67;
  undefined1 auVar68 [15];
  ushort uVar69;
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  unkuint9 Var92;
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  unkuint9 Var95;
  undefined1 auVar96 [11];
  undefined1 auVar97 [15];
  unkuint9 Var98;
  undefined1 auVar99 [11];
  undefined1 auVar100 [15];
  unkuint9 Var101;
  undefined1 auVar102 [11];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  int iVar111;
  uint8_t *puVar112;
  undefined4 uVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  short sVar121;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar131;
  short sVar134;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  short sVar137;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  short sVar186;
  short sVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  byte bVar129;
  byte bVar130;
  byte bVar132;
  byte bVar133;
  byte bVar135;
  byte bVar136;
  byte bVar138;
  byte bVar142;
  byte bVar143;
  byte bVar144;
  byte bVar145;
  byte bVar146;
  byte bVar147;
  byte bVar148;
  byte bVar152;
  byte bVar153;
  byte bVar154;
  byte bVar155;
  byte bVar156;
  byte bVar157;
  byte bVar158;
  byte bVar162;
  byte bVar163;
  byte bVar164;
  byte bVar165;
  byte bVar166;
  byte bVar167;
  byte bVar168;
  short sVar171;
  short sVar175;
  short sVar185;
  short sVar199;
  
  auVar114 = *(undefined1 (*) [16])above;
  auVar120 = *(undefined1 (*) [16])(above + 0x10);
  auVar115 = *(undefined1 (*) [16])(above + 0x20);
  auVar116 = *(undefined1 (*) [16])(above + 0x30);
  auVar59[0xd] = 0;
  auVar59._0_13_ = auVar114._0_13_;
  auVar59[0xe] = auVar114[7];
  uVar63 = auVar59._13_2_;
  auVar64[0xc] = auVar114[6];
  auVar64._0_12_ = auVar114._0_12_;
  auVar64._13_2_ = uVar63;
  auVar71[0xb] = 0;
  auVar71._0_11_ = auVar114._0_11_;
  auVar71._12_3_ = auVar64._12_3_;
  auVar75[10] = auVar114[5];
  auVar75._0_10_ = auVar114._0_10_;
  auVar75._11_4_ = auVar71._11_4_;
  auVar79[9] = 0;
  auVar79._0_9_ = auVar114._0_9_;
  auVar79._10_5_ = auVar75._10_5_;
  auVar83[8] = auVar114[4];
  auVar83._0_8_ = auVar114._0_8_;
  auVar83._9_6_ = auVar79._9_6_;
  auVar91._7_8_ = 0;
  auVar91._0_7_ = auVar83._8_7_;
  Var92 = CONCAT81(SUB158(auVar91 << 0x40,7),auVar114[3]);
  auVar103._9_6_ = 0;
  auVar103._0_9_ = Var92;
  auVar93._1_10_ = SUB1510(auVar103 << 0x30,5);
  auVar93[0] = auVar114[2];
  auVar104._11_4_ = 0;
  auVar104._0_11_ = auVar93;
  auVar87[2] = auVar114[1];
  auVar87._0_2_ = auVar114._0_2_;
  auVar87._3_12_ = SUB1512(auVar104 << 0x20,3);
  auVar169._0_2_ = auVar114._0_2_ & 0xff;
  auVar169._2_13_ = auVar87._2_13_;
  auVar169[0xf] = 0;
  auVar122._0_2_ = CONCAT11(0,auVar114[8]);
  bVar129 = auVar114[9];
  auVar122[2] = bVar129;
  auVar122[3] = 0;
  bVar130 = auVar114[10];
  auVar122[4] = bVar130;
  auVar122[5] = 0;
  bVar132 = auVar114[0xb];
  auVar122[6] = bVar132;
  auVar122[7] = 0;
  bVar133 = auVar114[0xc];
  auVar122[8] = bVar133;
  auVar122[9] = 0;
  bVar135 = auVar114[0xd];
  auVar122[10] = bVar135;
  auVar122[0xb] = 0;
  bVar136 = auVar114[0xe];
  auVar122[0xc] = bVar136;
  auVar122[0xd] = 0;
  bVar138 = auVar114[0xf];
  auVar122[0xe] = bVar138;
  auVar122[0xf] = 0;
  auVar60[0xd] = 0;
  auVar60._0_13_ = auVar120._0_13_;
  auVar60[0xe] = auVar120[7];
  uVar65 = auVar60._13_2_;
  auVar66[0xc] = auVar120[6];
  auVar66._0_12_ = auVar120._0_12_;
  auVar66._13_2_ = uVar65;
  auVar72[0xb] = 0;
  auVar72._0_11_ = auVar120._0_11_;
  auVar72._12_3_ = auVar66._12_3_;
  auVar76[10] = auVar120[5];
  auVar76._0_10_ = auVar120._0_10_;
  auVar76._11_4_ = auVar72._11_4_;
  auVar80[9] = 0;
  auVar80._0_9_ = auVar120._0_9_;
  auVar80._10_5_ = auVar76._10_5_;
  auVar84[8] = auVar120[4];
  auVar84._0_8_ = auVar120._0_8_;
  auVar84._9_6_ = auVar80._9_6_;
  auVar94._7_8_ = 0;
  auVar94._0_7_ = auVar84._8_7_;
  Var95 = CONCAT81(SUB158(auVar94 << 0x40,7),auVar120[3]);
  auVar105._9_6_ = 0;
  auVar105._0_9_ = Var95;
  auVar96._1_10_ = SUB1510(auVar105 << 0x30,5);
  auVar96[0] = auVar120[2];
  auVar106._11_4_ = 0;
  auVar106._0_11_ = auVar96;
  auVar88[2] = auVar120[1];
  auVar88._0_2_ = auVar120._0_2_;
  auVar88._3_12_ = SUB1512(auVar106 << 0x20,3);
  auVar172._0_2_ = auVar120._0_2_ & 0xff;
  auVar172._2_13_ = auVar88._2_13_;
  auVar172[0xf] = 0;
  auVar139._0_2_ = CONCAT11(0,auVar120[8]);
  bVar142 = auVar120[9];
  auVar139[2] = bVar142;
  auVar139[3] = 0;
  bVar143 = auVar120[10];
  auVar139[4] = bVar143;
  auVar139[5] = 0;
  bVar144 = auVar120[0xb];
  auVar139[6] = bVar144;
  auVar139[7] = 0;
  bVar145 = auVar120[0xc];
  auVar139[8] = bVar145;
  auVar139[9] = 0;
  bVar146 = auVar120[0xd];
  auVar139[10] = bVar146;
  auVar139[0xb] = 0;
  bVar147 = auVar120[0xe];
  auVar139[0xc] = bVar147;
  auVar139[0xd] = 0;
  bVar148 = auVar120[0xf];
  auVar139[0xe] = bVar148;
  auVar139[0xf] = 0;
  auVar61[0xd] = 0;
  auVar61._0_13_ = auVar115._0_13_;
  auVar61[0xe] = auVar115[7];
  uVar67 = auVar61._13_2_;
  auVar68[0xc] = auVar115[6];
  auVar68._0_12_ = auVar115._0_12_;
  auVar68._13_2_ = uVar67;
  auVar73[0xb] = 0;
  auVar73._0_11_ = auVar115._0_11_;
  auVar73._12_3_ = auVar68._12_3_;
  auVar77[10] = auVar115[5];
  auVar77._0_10_ = auVar115._0_10_;
  auVar77._11_4_ = auVar73._11_4_;
  auVar81[9] = 0;
  auVar81._0_9_ = auVar115._0_9_;
  auVar81._10_5_ = auVar77._10_5_;
  auVar85[8] = auVar115[4];
  auVar85._0_8_ = auVar115._0_8_;
  auVar85._9_6_ = auVar81._9_6_;
  auVar97._7_8_ = 0;
  auVar97._0_7_ = auVar85._8_7_;
  Var98 = CONCAT81(SUB158(auVar97 << 0x40,7),auVar115[3]);
  auVar107._9_6_ = 0;
  auVar107._0_9_ = Var98;
  auVar99._1_10_ = SUB1510(auVar107 << 0x30,5);
  auVar99[0] = auVar115[2];
  auVar108._11_4_ = 0;
  auVar108._0_11_ = auVar99;
  auVar89[2] = auVar115[1];
  auVar89._0_2_ = auVar115._0_2_;
  auVar89._3_12_ = SUB1512(auVar108 << 0x20,3);
  auVar176._0_2_ = auVar115._0_2_ & 0xff;
  auVar176._2_13_ = auVar89._2_13_;
  auVar176[0xf] = 0;
  auVar149._0_2_ = CONCAT11(0,auVar115[8]);
  bVar152 = auVar115[9];
  auVar149[2] = bVar152;
  auVar149[3] = 0;
  bVar153 = auVar115[10];
  auVar149[4] = bVar153;
  auVar149[5] = 0;
  bVar154 = auVar115[0xb];
  auVar149[6] = bVar154;
  auVar149[7] = 0;
  bVar155 = auVar115[0xc];
  auVar149[8] = bVar155;
  auVar149[9] = 0;
  bVar156 = auVar115[0xd];
  auVar149[10] = bVar156;
  auVar149[0xb] = 0;
  bVar157 = auVar115[0xe];
  auVar149[0xc] = bVar157;
  auVar149[0xd] = 0;
  bVar158 = auVar115[0xf];
  auVar149[0xe] = bVar158;
  auVar149[0xf] = 0;
  auVar62[0xd] = 0;
  auVar62._0_13_ = auVar116._0_13_;
  auVar62[0xe] = auVar116[7];
  uVar69 = auVar62._13_2_;
  auVar70[0xc] = auVar116[6];
  auVar70._0_12_ = auVar116._0_12_;
  auVar70._13_2_ = uVar69;
  auVar74[0xb] = 0;
  auVar74._0_11_ = auVar116._0_11_;
  auVar74._12_3_ = auVar70._12_3_;
  auVar78[10] = auVar116[5];
  auVar78._0_10_ = auVar116._0_10_;
  auVar78._11_4_ = auVar74._11_4_;
  auVar82[9] = 0;
  auVar82._0_9_ = auVar116._0_9_;
  auVar82._10_5_ = auVar78._10_5_;
  auVar86[8] = auVar116[4];
  auVar86._0_8_ = auVar116._0_8_;
  auVar86._9_6_ = auVar82._9_6_;
  auVar100._7_8_ = 0;
  auVar100._0_7_ = auVar86._8_7_;
  Var101 = CONCAT81(SUB158(auVar100 << 0x40,7),auVar116[3]);
  auVar109._9_6_ = 0;
  auVar109._0_9_ = Var101;
  auVar102._1_10_ = SUB1510(auVar109 << 0x30,5);
  auVar102[0] = auVar116[2];
  auVar110._11_4_ = 0;
  auVar110._0_11_ = auVar102;
  auVar90[2] = auVar116[1];
  auVar90._0_2_ = auVar116._0_2_;
  auVar90._3_12_ = SUB1512(auVar110 << 0x20,3);
  auVar188._0_2_ = auVar116._0_2_ & 0xff;
  auVar188._2_13_ = auVar90._2_13_;
  auVar188[0xf] = 0;
  auVar159._0_2_ = CONCAT11(0,auVar116[8]);
  bVar162 = auVar116[9];
  auVar159[2] = bVar162;
  auVar159[3] = 0;
  bVar163 = auVar116[10];
  auVar159[4] = bVar163;
  auVar159[5] = 0;
  bVar164 = auVar116[0xb];
  auVar159[6] = bVar164;
  auVar159[7] = 0;
  bVar165 = auVar116[0xc];
  auVar159[8] = bVar165;
  auVar159[9] = 0;
  bVar166 = auVar116[0xd];
  auVar159[10] = bVar166;
  auVar159[0xb] = 0;
  bVar167 = auVar116[0xe];
  auVar159[0xc] = bVar167;
  auVar159[0xd] = 0;
  bVar168 = auVar116[0xf];
  auVar159[0xe] = bVar168;
  auVar159[0xf] = 0;
  auVar114 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  uVar113 = auVar114._0_4_;
  sVar186 = auVar114._0_2_;
  sVar187 = auVar114._2_2_;
  auVar170._0_2_ = auVar169._0_2_ - sVar186;
  auVar170._2_2_ = auVar87._2_2_ - sVar187;
  auVar170._4_2_ = auVar93._0_2_ - sVar186;
  sVar171 = (short)Var92;
  auVar170._6_2_ = sVar171 - sVar187;
  auVar170._8_2_ = auVar83._8_2_ - sVar186;
  auVar170._10_2_ = auVar75._10_2_ - sVar187;
  auVar170._12_2_ = auVar64._12_2_ - sVar186;
  auVar170._14_2_ = (uVar63 >> 8) - sVar187;
  auVar123._0_2_ = auVar122._0_2_ - sVar186;
  auVar123._2_2_ = (ushort)bVar129 - sVar187;
  auVar123._4_2_ = (ushort)bVar130 - sVar186;
  auVar123._6_2_ = (ushort)bVar132 - sVar187;
  auVar123._8_2_ = (ushort)bVar133 - sVar186;
  auVar123._10_2_ = (ushort)bVar135 - sVar187;
  auVar123._12_2_ = (ushort)bVar136 - sVar186;
  auVar123._14_2_ = (ushort)bVar138 - sVar187;
  auVar173._0_2_ = auVar172._0_2_ - sVar186;
  auVar173._2_2_ = auVar88._2_2_ - sVar187;
  auVar173._4_2_ = auVar96._0_2_ - sVar186;
  sVar175 = (short)Var95;
  auVar173._6_2_ = sVar175 - sVar187;
  auVar173._8_2_ = auVar84._8_2_ - sVar186;
  auVar173._10_2_ = auVar76._10_2_ - sVar187;
  auVar173._12_2_ = auVar66._12_2_ - sVar186;
  auVar173._14_2_ = (uVar65 >> 8) - sVar187;
  auVar140._0_2_ = auVar139._0_2_ - sVar186;
  auVar140._2_2_ = (ushort)bVar142 - sVar187;
  auVar140._4_2_ = (ushort)bVar143 - sVar186;
  auVar140._6_2_ = (ushort)bVar144 - sVar187;
  auVar140._8_2_ = (ushort)bVar145 - sVar186;
  auVar140._10_2_ = (ushort)bVar146 - sVar187;
  auVar140._12_2_ = (ushort)bVar147 - sVar186;
  auVar140._14_2_ = (ushort)bVar148 - sVar187;
  auVar177._0_2_ = auVar176._0_2_ - sVar186;
  auVar177._2_2_ = auVar89._2_2_ - sVar187;
  auVar177._4_2_ = auVar99._0_2_ - sVar186;
  sVar185 = (short)Var98;
  auVar177._6_2_ = sVar185 - sVar187;
  auVar177._8_2_ = auVar85._8_2_ - sVar186;
  auVar177._10_2_ = auVar77._10_2_ - sVar187;
  auVar177._12_2_ = auVar68._12_2_ - sVar186;
  auVar177._14_2_ = (uVar67 >> 8) - sVar187;
  auVar150._0_2_ = auVar149._0_2_ - sVar186;
  auVar150._2_2_ = (ushort)bVar152 - sVar187;
  auVar150._4_2_ = (ushort)bVar153 - sVar186;
  auVar150._6_2_ = (ushort)bVar154 - sVar187;
  auVar150._8_2_ = (ushort)bVar155 - sVar186;
  auVar150._10_2_ = (ushort)bVar156 - sVar187;
  auVar150._12_2_ = (ushort)bVar157 - sVar186;
  auVar150._14_2_ = (ushort)bVar158 - sVar187;
  auVar189._0_2_ = auVar188._0_2_ - sVar186;
  auVar189._2_2_ = auVar90._2_2_ - sVar187;
  auVar189._4_2_ = auVar102._0_2_ - sVar186;
  sVar199 = (short)Var101;
  auVar189._6_2_ = sVar199 - sVar187;
  auVar189._8_2_ = auVar86._8_2_ - sVar186;
  auVar189._10_2_ = auVar78._10_2_ - sVar187;
  auVar189._12_2_ = auVar70._12_2_ - sVar186;
  auVar189._14_2_ = (uVar69 >> 8) - sVar187;
  auVar160._0_2_ = auVar159._0_2_ - sVar186;
  auVar160._2_2_ = (ushort)bVar162 - sVar187;
  auVar160._4_2_ = (ushort)bVar163 - sVar186;
  auVar160._6_2_ = (ushort)bVar164 - sVar187;
  auVar160._8_2_ = (ushort)bVar165 - sVar186;
  auVar160._10_2_ = (ushort)bVar166 - sVar187;
  auVar160._12_2_ = (ushort)bVar167 - sVar186;
  auVar160._14_2_ = (ushort)bVar168 - sVar187;
  puVar112 = dst + 0x30;
  iVar111 = 0x10;
  auVar114 = *(undefined1 (*) [16])left;
  auVar115 = pabsw(auVar114,auVar170);
  auVar116 = pabsw(auVar115,auVar123);
  auVar117 = pabsw(auVar116,auVar173);
  auVar118 = pabsw(auVar117,auVar140);
  auVar119 = pabsw(auVar118,auVar177);
  auVar151 = pabsw(auVar150,auVar150);
  auVar174 = pabsw(auVar173,auVar189);
  auVar141 = pabsw(auVar140,auVar160);
  auVar120 = _DAT_004d27e0;
  do {
    auVar124 = pshufb(auVar114,auVar120);
    sVar121 = auVar124._0_2_;
    sVar125 = auVar124._2_2_;
    sVar126 = auVar124._4_2_;
    sVar127 = auVar124._6_2_;
    sVar128 = auVar124._8_2_;
    sVar131 = auVar124._10_2_;
    sVar134 = auVar124._12_2_;
    sVar137 = auVar124._14_2_;
    auVar190._0_2_ = (auVar170._0_2_ + sVar121) - auVar169._0_2_;
    auVar190._2_2_ = (auVar170._2_2_ + sVar125) - auVar87._2_2_;
    auVar190._4_2_ = (auVar170._4_2_ + sVar126) - auVar93._0_2_;
    auVar190._6_2_ = (auVar170._6_2_ + sVar127) - sVar171;
    auVar190._8_2_ = (auVar170._8_2_ + sVar128) - auVar83._8_2_;
    auVar190._10_2_ = (auVar170._10_2_ + sVar131) - auVar75._10_2_;
    auVar190._12_2_ = (auVar170._12_2_ + sVar134) - auVar64._12_2_;
    auVar190._14_2_ = (auVar170._14_2_ + sVar137) - (uVar63 >> 8);
    auVar191 = pabsw(auVar190,auVar190);
    auVar201._0_2_ = (auVar170._0_2_ + sVar121) - sVar186;
    auVar201._2_2_ = (auVar170._2_2_ + sVar125) - sVar187;
    auVar201._4_2_ = (auVar170._4_2_ + sVar126) - sVar186;
    auVar201._6_2_ = (auVar170._6_2_ + sVar127) - sVar187;
    auVar201._8_2_ = (auVar170._8_2_ + sVar128) - sVar186;
    auVar201._10_2_ = (auVar170._10_2_ + sVar131) - sVar187;
    auVar201._12_2_ = (auVar170._12_2_ + sVar134) - sVar186;
    auVar201._14_2_ = (auVar170._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar201,auVar201);
    local_128 = auVar115._0_2_;
    sStack_126 = auVar115._2_2_;
    sStack_124 = auVar115._4_2_;
    sStack_122 = auVar115._6_2_;
    sStack_120 = auVar115._8_2_;
    sStack_11e = auVar115._10_2_;
    sStack_11c = auVar115._12_2_;
    sStack_11a = auVar115._14_2_;
    auVar211._0_2_ = -(ushort)(auVar191._0_2_ < local_128);
    auVar211._2_2_ = -(ushort)(auVar191._2_2_ < sStack_126);
    auVar211._4_2_ = -(ushort)(auVar191._4_2_ < sStack_124);
    auVar211._6_2_ = -(ushort)(auVar191._6_2_ < sStack_122);
    auVar211._8_2_ = -(ushort)(auVar191._8_2_ < sStack_120);
    auVar211._10_2_ = -(ushort)(auVar191._10_2_ < sStack_11e);
    auVar211._12_2_ = -(ushort)(auVar191._12_2_ < sStack_11c);
    auVar211._14_2_ = -(ushort)(auVar191._14_2_ < sStack_11a);
    auVar200._0_2_ = -(ushort)(auVar178._0_2_ < local_128);
    auVar200._2_2_ = -(ushort)(auVar178._2_2_ < sStack_126);
    auVar200._4_2_ = -(ushort)(auVar178._4_2_ < sStack_124);
    auVar200._6_2_ = -(ushort)(auVar178._6_2_ < sStack_122);
    auVar200._8_2_ = -(ushort)(auVar178._8_2_ < sStack_120);
    auVar200._10_2_ = -(ushort)(auVar178._10_2_ < sStack_11e);
    auVar200._12_2_ = -(ushort)(auVar178._12_2_ < sStack_11c);
    auVar200._14_2_ = -(ushort)(auVar178._14_2_ < sStack_11a);
    auVar192._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar192._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar192._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar192._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar192._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar192._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar192._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar192._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar178._4_2_ = sVar186;
    auVar178._0_4_ = uVar113;
    auVar178._6_2_ = sVar187;
    auVar178._8_2_ = sVar186;
    auVar178._10_2_ = sVar187;
    auVar178._12_2_ = sVar186;
    auVar178._14_2_ = sVar187;
    auVar212._0_2_ = (auVar123._0_2_ + sVar121) - auVar122._0_2_;
    auVar212._2_2_ = (auVar123._2_2_ + sVar125) - (ushort)bVar129;
    auVar212._4_2_ = (auVar123._4_2_ + sVar126) - (ushort)bVar130;
    auVar212._6_2_ = (auVar123._6_2_ + sVar127) - (ushort)bVar132;
    auVar212._8_2_ = (auVar123._8_2_ + sVar128) - (ushort)bVar133;
    auVar212._10_2_ = (auVar123._10_2_ + sVar131) - (ushort)bVar135;
    auVar212._12_2_ = (auVar123._12_2_ + sVar134) - (ushort)bVar136;
    auVar212._14_2_ = (auVar123._14_2_ + sVar137) - (ushort)bVar138;
    auVar213 = pabsw(auVar212,auVar212);
    auVar203._0_2_ = (auVar123._0_2_ + sVar121) - sVar186;
    auVar203._2_2_ = (auVar123._2_2_ + sVar125) - sVar187;
    auVar203._4_2_ = (auVar123._4_2_ + sVar126) - sVar186;
    auVar203._6_2_ = (auVar123._6_2_ + sVar127) - sVar187;
    auVar203._8_2_ = (auVar123._8_2_ + sVar128) - sVar186;
    auVar203._10_2_ = (auVar123._10_2_ + sVar131) - sVar187;
    auVar203._12_2_ = (auVar123._12_2_ + sVar134) - sVar186;
    auVar203._14_2_ = (auVar123._14_2_ + sVar137) - sVar187;
    auVar191 = pabsw(auVar203,auVar203);
    local_138 = auVar116._0_2_;
    sStack_136 = auVar116._2_2_;
    sStack_134 = auVar116._4_2_;
    sStack_132 = auVar116._6_2_;
    sStack_130 = auVar116._8_2_;
    sStack_12e = auVar116._10_2_;
    sStack_12c = auVar116._12_2_;
    sStack_12a = auVar116._14_2_;
    auVar222._0_2_ = -(ushort)(auVar213._0_2_ < local_138);
    auVar222._2_2_ = -(ushort)(auVar213._2_2_ < sStack_136);
    auVar222._4_2_ = -(ushort)(auVar213._4_2_ < sStack_134);
    auVar222._6_2_ = -(ushort)(auVar213._6_2_ < sStack_132);
    auVar222._8_2_ = -(ushort)(auVar213._8_2_ < sStack_130);
    auVar222._10_2_ = -(ushort)(auVar213._10_2_ < sStack_12e);
    auVar222._12_2_ = -(ushort)(auVar213._12_2_ < sStack_12c);
    auVar222._14_2_ = -(ushort)(auVar213._14_2_ < sStack_12a);
    auVar202._0_2_ = -(ushort)(auVar191._0_2_ < local_138);
    auVar202._2_2_ = -(ushort)(auVar191._2_2_ < sStack_136);
    auVar202._4_2_ = -(ushort)(auVar191._4_2_ < sStack_134);
    auVar202._6_2_ = -(ushort)(auVar191._6_2_ < sStack_132);
    auVar202._8_2_ = -(ushort)(auVar191._8_2_ < sStack_130);
    auVar202._10_2_ = -(ushort)(auVar191._10_2_ < sStack_12e);
    auVar202._12_2_ = -(ushort)(auVar191._12_2_ < sStack_12c);
    auVar202._14_2_ = -(ushort)(auVar191._14_2_ < sStack_12a);
    auVar214._0_2_ = -(ushort)(auVar191._0_2_ < auVar213._0_2_);
    auVar214._2_2_ = -(ushort)(auVar191._2_2_ < auVar213._2_2_);
    auVar214._4_2_ = -(ushort)(auVar191._4_2_ < auVar213._4_2_);
    auVar214._6_2_ = -(ushort)(auVar191._6_2_ < auVar213._6_2_);
    auVar214._8_2_ = -(ushort)(auVar191._8_2_ < auVar213._8_2_);
    auVar214._10_2_ = -(ushort)(auVar191._10_2_ < auVar213._10_2_);
    auVar214._12_2_ = -(ushort)(auVar191._12_2_ < auVar213._12_2_);
    auVar214._14_2_ = -(ushort)(auVar191._14_2_ < auVar213._14_2_);
    auVar191._4_2_ = sVar186;
    auVar191._0_4_ = uVar113;
    auVar191._6_2_ = sVar187;
    auVar191._8_2_ = sVar186;
    auVar191._10_2_ = sVar187;
    auVar191._12_2_ = sVar186;
    auVar191._14_2_ = sVar187;
    auVar201 = ~(auVar200 | auVar211) & auVar124 |
               (~auVar192 & auVar169 | auVar178 & auVar192) & (auVar200 | auVar211);
    auVar203 = ~(auVar202 | auVar222) & auVar124 |
               (~auVar214 & auVar122 | auVar191 & auVar214) & (auVar202 | auVar222);
    sVar1 = auVar201._0_2_;
    sVar4 = auVar201._2_2_;
    sVar7 = auVar201._4_2_;
    sVar10 = auVar201._6_2_;
    sVar13 = auVar201._8_2_;
    sVar16 = auVar201._10_2_;
    sVar19 = auVar201._12_2_;
    sVar22 = auVar201._14_2_;
    sVar25 = auVar203._0_2_;
    sVar29 = auVar203._2_2_;
    sVar33 = auVar203._4_2_;
    sVar37 = auVar203._6_2_;
    sVar41 = auVar203._8_2_;
    sVar45 = auVar203._10_2_;
    sVar49 = auVar203._12_2_;
    sVar53 = auVar203._14_2_;
    auVar193._0_2_ = (auVar173._0_2_ + sVar121) - auVar172._0_2_;
    auVar193._2_2_ = (auVar173._2_2_ + sVar125) - auVar88._2_2_;
    auVar193._4_2_ = (auVar173._4_2_ + sVar126) - auVar96._0_2_;
    auVar193._6_2_ = (auVar173._6_2_ + sVar127) - sVar175;
    auVar193._8_2_ = (auVar173._8_2_ + sVar128) - auVar84._8_2_;
    auVar193._10_2_ = (auVar173._10_2_ + sVar131) - auVar76._10_2_;
    auVar193._12_2_ = (auVar173._12_2_ + sVar134) - auVar66._12_2_;
    auVar193._14_2_ = (auVar173._14_2_ + sVar137) - (uVar65 >> 8);
    auVar191 = pabsw(auVar193,auVar193);
    auVar179._0_2_ = (auVar173._0_2_ + sVar121) - sVar186;
    auVar179._2_2_ = (auVar173._2_2_ + sVar125) - sVar187;
    auVar179._4_2_ = (auVar173._4_2_ + sVar126) - sVar186;
    auVar179._6_2_ = (auVar173._6_2_ + sVar127) - sVar187;
    auVar179._8_2_ = (auVar173._8_2_ + sVar128) - sVar186;
    auVar179._10_2_ = (auVar173._10_2_ + sVar131) - sVar187;
    auVar179._12_2_ = (auVar173._12_2_ + sVar134) - sVar186;
    auVar179._14_2_ = (auVar173._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar179,auVar179);
    local_148 = auVar117._0_2_;
    sStack_146 = auVar117._2_2_;
    sStack_144 = auVar117._4_2_;
    sStack_142 = auVar117._6_2_;
    sStack_140 = auVar117._8_2_;
    sStack_13e = auVar117._10_2_;
    sStack_13c = auVar117._12_2_;
    sStack_13a = auVar117._14_2_;
    auVar204._0_2_ = -(ushort)(auVar191._0_2_ < local_148);
    auVar204._2_2_ = -(ushort)(auVar191._2_2_ < sStack_146);
    auVar204._4_2_ = -(ushort)(auVar191._4_2_ < sStack_144);
    auVar204._6_2_ = -(ushort)(auVar191._6_2_ < sStack_142);
    auVar204._8_2_ = -(ushort)(auVar191._8_2_ < sStack_140);
    auVar204._10_2_ = -(ushort)(auVar191._10_2_ < sStack_13e);
    auVar204._12_2_ = -(ushort)(auVar191._12_2_ < sStack_13c);
    auVar204._14_2_ = -(ushort)(auVar191._14_2_ < sStack_13a);
    auVar215._0_2_ = -(ushort)(auVar178._0_2_ < local_148);
    auVar215._2_2_ = -(ushort)(auVar178._2_2_ < sStack_146);
    auVar215._4_2_ = -(ushort)(auVar178._4_2_ < sStack_144);
    auVar215._6_2_ = -(ushort)(auVar178._6_2_ < sStack_142);
    auVar215._8_2_ = -(ushort)(auVar178._8_2_ < sStack_140);
    auVar215._10_2_ = -(ushort)(auVar178._10_2_ < sStack_13e);
    auVar215._12_2_ = -(ushort)(auVar178._12_2_ < sStack_13c);
    auVar215._14_2_ = -(ushort)(auVar178._14_2_ < sStack_13a);
    auVar194._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar194._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar194._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar194._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar194._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar194._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar194._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar194._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar213._4_2_ = sVar186;
    auVar213._0_4_ = uVar113;
    auVar213._6_2_ = sVar187;
    auVar213._8_2_ = sVar186;
    auVar213._10_2_ = sVar187;
    auVar213._12_2_ = sVar186;
    auVar213._14_2_ = sVar187;
    auVar205._0_2_ = (auVar140._0_2_ + sVar121) - auVar139._0_2_;
    auVar205._2_2_ = (auVar140._2_2_ + sVar125) - (ushort)bVar142;
    auVar205._4_2_ = (auVar140._4_2_ + sVar126) - (ushort)bVar143;
    auVar205._6_2_ = (auVar140._6_2_ + sVar127) - (ushort)bVar144;
    auVar205._8_2_ = (auVar140._8_2_ + sVar128) - (ushort)bVar145;
    auVar205._10_2_ = (auVar140._10_2_ + sVar131) - (ushort)bVar146;
    auVar205._12_2_ = (auVar140._12_2_ + sVar134) - (ushort)bVar147;
    auVar205._14_2_ = (auVar140._14_2_ + sVar137) - (ushort)bVar148;
    auVar191 = pabsw(auVar205,auVar205);
    auVar180._0_2_ = (auVar140._0_2_ + sVar121) - sVar186;
    auVar180._2_2_ = (auVar140._2_2_ + sVar125) - sVar187;
    auVar180._4_2_ = (auVar140._4_2_ + sVar126) - sVar186;
    auVar180._6_2_ = (auVar140._6_2_ + sVar127) - sVar187;
    auVar180._8_2_ = (auVar140._8_2_ + sVar128) - sVar186;
    auVar180._10_2_ = (auVar140._10_2_ + sVar131) - sVar187;
    auVar180._12_2_ = (auVar140._12_2_ + sVar134) - sVar186;
    auVar180._14_2_ = (auVar140._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar180,auVar180);
    local_158 = auVar118._0_2_;
    sStack_156 = auVar118._2_2_;
    sStack_154 = auVar118._4_2_;
    sStack_152 = auVar118._6_2_;
    sStack_150 = auVar118._8_2_;
    sStack_14e = auVar118._10_2_;
    sStack_14c = auVar118._12_2_;
    sStack_14a = auVar118._14_2_;
    auVar223._0_2_ = -(ushort)(auVar191._0_2_ < local_158);
    auVar223._2_2_ = -(ushort)(auVar191._2_2_ < sStack_156);
    auVar223._4_2_ = -(ushort)(auVar191._4_2_ < sStack_154);
    auVar223._6_2_ = -(ushort)(auVar191._6_2_ < sStack_152);
    auVar223._8_2_ = -(ushort)(auVar191._8_2_ < sStack_150);
    auVar223._10_2_ = -(ushort)(auVar191._10_2_ < sStack_14e);
    auVar223._12_2_ = -(ushort)(auVar191._12_2_ < sStack_14c);
    auVar223._14_2_ = -(ushort)(auVar191._14_2_ < sStack_14a);
    auVar216._0_2_ = -(ushort)(auVar178._0_2_ < local_158);
    auVar216._2_2_ = -(ushort)(auVar178._2_2_ < sStack_156);
    auVar216._4_2_ = -(ushort)(auVar178._4_2_ < sStack_154);
    auVar216._6_2_ = -(ushort)(auVar178._6_2_ < sStack_152);
    auVar216._8_2_ = -(ushort)(auVar178._8_2_ < sStack_150);
    auVar216._10_2_ = -(ushort)(auVar178._10_2_ < sStack_14e);
    auVar216._12_2_ = -(ushort)(auVar178._12_2_ < sStack_14c);
    auVar216._14_2_ = -(ushort)(auVar178._14_2_ < sStack_14a);
    auVar206._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar206._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar206._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar206._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar206._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar206._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar206._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar206._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar217._4_2_ = sVar186;
    auVar217._0_4_ = uVar113;
    auVar217._6_2_ = sVar187;
    auVar217._8_2_ = sVar186;
    auVar217._10_2_ = sVar187;
    auVar217._12_2_ = sVar186;
    auVar217._14_2_ = sVar187;
    auVar213 = ~(auVar215 | auVar204) & auVar124 |
               (~auVar194 & auVar172 | auVar213 & auVar194) & (auVar215 | auVar204);
    auVar217 = ~(auVar216 | auVar223) & auVar124 |
               (~auVar206 & auVar139 | auVar217 & auVar206) & (auVar216 | auVar223);
    sVar2 = auVar213._0_2_;
    sVar5 = auVar213._2_2_;
    sVar8 = auVar213._4_2_;
    sVar11 = auVar213._6_2_;
    sVar14 = auVar213._8_2_;
    sVar17 = auVar213._10_2_;
    sVar20 = auVar213._12_2_;
    sVar23 = auVar213._14_2_;
    sVar26 = auVar217._0_2_;
    sVar30 = auVar217._2_2_;
    sVar34 = auVar217._4_2_;
    sVar38 = auVar217._6_2_;
    sVar42 = auVar217._8_2_;
    sVar46 = auVar217._10_2_;
    sVar50 = auVar217._12_2_;
    sVar54 = auVar217._14_2_;
    auVar195._0_2_ = (auVar177._0_2_ + sVar121) - auVar176._0_2_;
    auVar195._2_2_ = (auVar177._2_2_ + sVar125) - auVar89._2_2_;
    auVar195._4_2_ = (auVar177._4_2_ + sVar126) - auVar99._0_2_;
    auVar195._6_2_ = (auVar177._6_2_ + sVar127) - sVar185;
    auVar195._8_2_ = (auVar177._8_2_ + sVar128) - auVar85._8_2_;
    auVar195._10_2_ = (auVar177._10_2_ + sVar131) - auVar77._10_2_;
    auVar195._12_2_ = (auVar177._12_2_ + sVar134) - auVar68._12_2_;
    auVar195._14_2_ = (auVar177._14_2_ + sVar137) - (uVar67 >> 8);
    auVar191 = pabsw(auVar195,auVar195);
    auVar181._0_2_ = (auVar177._0_2_ + sVar121) - sVar186;
    auVar181._2_2_ = (auVar177._2_2_ + sVar125) - sVar187;
    auVar181._4_2_ = (auVar177._4_2_ + sVar126) - sVar186;
    auVar181._6_2_ = (auVar177._6_2_ + sVar127) - sVar187;
    auVar181._8_2_ = (auVar177._8_2_ + sVar128) - sVar186;
    auVar181._10_2_ = (auVar177._10_2_ + sVar131) - sVar187;
    auVar181._12_2_ = (auVar177._12_2_ + sVar134) - sVar186;
    auVar181._14_2_ = (auVar177._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar181,auVar181);
    local_168 = auVar119._0_2_;
    sStack_166 = auVar119._2_2_;
    sStack_164 = auVar119._4_2_;
    sStack_162 = auVar119._6_2_;
    sStack_160 = auVar119._8_2_;
    sStack_15e = auVar119._10_2_;
    sStack_15c = auVar119._12_2_;
    sStack_15a = auVar119._14_2_;
    auVar207._0_2_ = -(ushort)(auVar191._0_2_ < local_168);
    auVar207._2_2_ = -(ushort)(auVar191._2_2_ < sStack_166);
    auVar207._4_2_ = -(ushort)(auVar191._4_2_ < sStack_164);
    auVar207._6_2_ = -(ushort)(auVar191._6_2_ < sStack_162);
    auVar207._8_2_ = -(ushort)(auVar191._8_2_ < sStack_160);
    auVar207._10_2_ = -(ushort)(auVar191._10_2_ < sStack_15e);
    auVar207._12_2_ = -(ushort)(auVar191._12_2_ < sStack_15c);
    auVar207._14_2_ = -(ushort)(auVar191._14_2_ < sStack_15a);
    auVar224._0_2_ = -(ushort)(auVar178._0_2_ < local_168);
    auVar224._2_2_ = -(ushort)(auVar178._2_2_ < sStack_166);
    auVar224._4_2_ = -(ushort)(auVar178._4_2_ < sStack_164);
    auVar224._6_2_ = -(ushort)(auVar178._6_2_ < sStack_162);
    auVar224._8_2_ = -(ushort)(auVar178._8_2_ < sStack_160);
    auVar224._10_2_ = -(ushort)(auVar178._10_2_ < sStack_15e);
    auVar224._12_2_ = -(ushort)(auVar178._12_2_ < sStack_15c);
    auVar224._14_2_ = -(ushort)(auVar178._14_2_ < sStack_15a);
    auVar196._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar196._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar196._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar196._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar196._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar196._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar196._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar196._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar225._4_2_ = sVar186;
    auVar225._0_4_ = uVar113;
    auVar225._6_2_ = sVar187;
    auVar225._8_2_ = sVar186;
    auVar225._10_2_ = sVar187;
    auVar225._12_2_ = sVar186;
    auVar225._14_2_ = sVar187;
    auVar208._0_2_ = (auVar150._0_2_ + sVar121) - auVar149._0_2_;
    auVar208._2_2_ = (auVar150._2_2_ + sVar125) - (ushort)bVar152;
    auVar208._4_2_ = (auVar150._4_2_ + sVar126) - (ushort)bVar153;
    auVar208._6_2_ = (auVar150._6_2_ + sVar127) - (ushort)bVar154;
    auVar208._8_2_ = (auVar150._8_2_ + sVar128) - (ushort)bVar155;
    auVar208._10_2_ = (auVar150._10_2_ + sVar131) - (ushort)bVar156;
    auVar208._12_2_ = (auVar150._12_2_ + sVar134) - (ushort)bVar157;
    auVar208._14_2_ = (auVar150._14_2_ + sVar137) - (ushort)bVar158;
    auVar191 = pabsw(auVar208,auVar208);
    auVar182._0_2_ = (auVar150._0_2_ + sVar121) - sVar186;
    auVar182._2_2_ = (auVar150._2_2_ + sVar125) - sVar187;
    auVar182._4_2_ = (auVar150._4_2_ + sVar126) - sVar186;
    auVar182._6_2_ = (auVar150._6_2_ + sVar127) - sVar187;
    auVar182._8_2_ = (auVar150._8_2_ + sVar128) - sVar186;
    auVar182._10_2_ = (auVar150._10_2_ + sVar131) - sVar187;
    auVar182._12_2_ = (auVar150._12_2_ + sVar134) - sVar186;
    auVar182._14_2_ = (auVar150._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar182,auVar182);
    auVar218._0_2_ = -(ushort)(auVar191._0_2_ < auVar151._0_2_);
    auVar218._2_2_ = -(ushort)(auVar191._2_2_ < auVar151._2_2_);
    auVar218._4_2_ = -(ushort)(auVar191._4_2_ < auVar151._4_2_);
    auVar218._6_2_ = -(ushort)(auVar191._6_2_ < auVar151._6_2_);
    auVar218._8_2_ = -(ushort)(auVar191._8_2_ < auVar151._8_2_);
    auVar218._10_2_ = -(ushort)(auVar191._10_2_ < auVar151._10_2_);
    auVar218._12_2_ = -(ushort)(auVar191._12_2_ < auVar151._12_2_);
    auVar218._14_2_ = -(ushort)(auVar191._14_2_ < auVar151._14_2_);
    auVar226._0_2_ = -(ushort)(auVar178._0_2_ < auVar151._0_2_);
    auVar226._2_2_ = -(ushort)(auVar178._2_2_ < auVar151._2_2_);
    auVar226._4_2_ = -(ushort)(auVar178._4_2_ < auVar151._4_2_);
    auVar226._6_2_ = -(ushort)(auVar178._6_2_ < auVar151._6_2_);
    auVar226._8_2_ = -(ushort)(auVar178._8_2_ < auVar151._8_2_);
    auVar226._10_2_ = -(ushort)(auVar178._10_2_ < auVar151._10_2_);
    auVar226._12_2_ = -(ushort)(auVar178._12_2_ < auVar151._12_2_);
    auVar226._14_2_ = -(ushort)(auVar178._14_2_ < auVar151._14_2_);
    auVar209._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar209._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar209._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar209._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar209._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar209._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar209._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar209._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar227._4_2_ = sVar186;
    auVar227._0_4_ = uVar113;
    auVar227._6_2_ = sVar187;
    auVar227._8_2_ = sVar186;
    auVar227._10_2_ = sVar187;
    auVar227._12_2_ = sVar186;
    auVar227._14_2_ = sVar187;
    auVar225 = ~(auVar224 | auVar207) & auVar124 |
               (~auVar196 & auVar176 | auVar225 & auVar196) & (auVar224 | auVar207);
    auVar191 = (~auVar209 & auVar149 | auVar227 & auVar209) & (auVar226 | auVar218);
    auVar227 = ~(auVar226 | auVar218) & auVar124 | auVar191;
    sVar3 = auVar225._0_2_;
    sVar6 = auVar225._2_2_;
    sVar9 = auVar225._4_2_;
    sVar12 = auVar225._6_2_;
    sVar15 = auVar225._8_2_;
    sVar18 = auVar225._10_2_;
    sVar21 = auVar225._12_2_;
    sVar24 = auVar225._14_2_;
    sVar27 = auVar227._0_2_;
    sVar31 = auVar227._2_2_;
    sVar35 = auVar227._4_2_;
    sVar39 = auVar227._6_2_;
    sVar43 = auVar227._8_2_;
    sVar47 = auVar227._10_2_;
    sVar51 = auVar227._12_2_;
    sVar55 = auVar227._14_2_;
    auVar183._0_2_ = (auVar189._0_2_ + sVar121) - auVar188._0_2_;
    auVar183._2_2_ = (auVar189._2_2_ + sVar125) - auVar90._2_2_;
    auVar183._4_2_ = (auVar189._4_2_ + sVar126) - auVar102._0_2_;
    auVar183._6_2_ = (auVar189._6_2_ + sVar127) - sVar199;
    auVar183._8_2_ = (auVar189._8_2_ + sVar128) - auVar86._8_2_;
    auVar183._10_2_ = (auVar189._10_2_ + sVar131) - auVar78._10_2_;
    auVar183._12_2_ = (auVar189._12_2_ + sVar134) - auVar70._12_2_;
    auVar183._14_2_ = (auVar189._14_2_ + sVar137) - (uVar69 >> 8);
    auVar178 = pabsw(auVar183,auVar183);
    auVar197._0_2_ = (auVar189._0_2_ + sVar121) - sVar186;
    auVar197._2_2_ = (auVar189._2_2_ + sVar125) - sVar187;
    auVar197._4_2_ = (auVar189._4_2_ + sVar126) - sVar186;
    auVar197._6_2_ = (auVar189._6_2_ + sVar127) - sVar187;
    auVar197._8_2_ = (auVar189._8_2_ + sVar128) - sVar186;
    auVar197._10_2_ = (auVar189._10_2_ + sVar131) - sVar187;
    auVar197._12_2_ = (auVar189._12_2_ + sVar134) - sVar186;
    auVar197._14_2_ = (auVar189._14_2_ + sVar137) - sVar187;
    auVar191 = pabsw(auVar191,auVar197);
    auVar219._0_2_ = -(ushort)(auVar178._0_2_ < auVar174._0_2_);
    auVar219._2_2_ = -(ushort)(auVar178._2_2_ < auVar174._2_2_);
    auVar219._4_2_ = -(ushort)(auVar178._4_2_ < auVar174._4_2_);
    auVar219._6_2_ = -(ushort)(auVar178._6_2_ < auVar174._6_2_);
    auVar219._8_2_ = -(ushort)(auVar178._8_2_ < auVar174._8_2_);
    auVar219._10_2_ = -(ushort)(auVar178._10_2_ < auVar174._10_2_);
    auVar219._12_2_ = -(ushort)(auVar178._12_2_ < auVar174._12_2_);
    auVar219._14_2_ = -(ushort)(auVar178._14_2_ < auVar174._14_2_);
    auVar198._0_2_ = -(ushort)(auVar191._0_2_ < auVar174._0_2_);
    auVar198._2_2_ = -(ushort)(auVar191._2_2_ < auVar174._2_2_);
    auVar198._4_2_ = -(ushort)(auVar191._4_2_ < auVar174._4_2_);
    auVar198._6_2_ = -(ushort)(auVar191._6_2_ < auVar174._6_2_);
    auVar198._8_2_ = -(ushort)(auVar191._8_2_ < auVar174._8_2_);
    auVar198._10_2_ = -(ushort)(auVar191._10_2_ < auVar174._10_2_);
    auVar198._12_2_ = -(ushort)(auVar191._12_2_ < auVar174._12_2_);
    auVar198._14_2_ = -(ushort)(auVar191._14_2_ < auVar174._14_2_);
    auVar184._0_2_ = -(ushort)(auVar191._0_2_ < auVar178._0_2_);
    auVar184._2_2_ = -(ushort)(auVar191._2_2_ < auVar178._2_2_);
    auVar184._4_2_ = -(ushort)(auVar191._4_2_ < auVar178._4_2_);
    auVar184._6_2_ = -(ushort)(auVar191._6_2_ < auVar178._6_2_);
    auVar184._8_2_ = -(ushort)(auVar191._8_2_ < auVar178._8_2_);
    auVar184._10_2_ = -(ushort)(auVar191._10_2_ < auVar178._10_2_);
    auVar184._12_2_ = -(ushort)(auVar191._12_2_ < auVar178._12_2_);
    auVar184._14_2_ = -(ushort)(auVar191._14_2_ < auVar178._14_2_);
    auVar57._4_2_ = sVar186;
    auVar57._0_4_ = uVar113;
    auVar57._6_2_ = sVar187;
    auVar57._8_2_ = sVar186;
    auVar57._10_2_ = sVar187;
    auVar57._12_2_ = sVar186;
    auVar57._14_2_ = sVar187;
    auVar220._0_2_ = (auVar160._0_2_ + sVar121) - auVar159._0_2_;
    auVar220._2_2_ = (auVar160._2_2_ + sVar125) - (ushort)bVar162;
    auVar220._4_2_ = (auVar160._4_2_ + sVar126) - (ushort)bVar163;
    auVar220._6_2_ = (auVar160._6_2_ + sVar127) - (ushort)bVar164;
    auVar220._8_2_ = (auVar160._8_2_ + sVar128) - (ushort)bVar165;
    auVar220._10_2_ = (auVar160._10_2_ + sVar131) - (ushort)bVar166;
    auVar220._12_2_ = (auVar160._12_2_ + sVar134) - (ushort)bVar167;
    auVar220._14_2_ = (auVar160._14_2_ + sVar137) - (ushort)bVar168;
    auVar191 = pabsw(auVar220,auVar220);
    auVar210._0_2_ = (auVar160._0_2_ + sVar121) - sVar186;
    auVar210._2_2_ = (auVar160._2_2_ + sVar125) - sVar187;
    auVar210._4_2_ = (auVar160._4_2_ + sVar126) - sVar186;
    auVar210._6_2_ = (auVar160._6_2_ + sVar127) - sVar187;
    auVar210._8_2_ = (auVar160._8_2_ + sVar128) - sVar186;
    auVar210._10_2_ = (auVar160._10_2_ + sVar131) - sVar187;
    auVar210._12_2_ = (auVar160._12_2_ + sVar134) - sVar186;
    auVar210._14_2_ = (auVar160._14_2_ + sVar137) - sVar187;
    auVar178 = pabsw(auVar210,auVar210);
    auVar228._0_2_ = -(ushort)(auVar191._0_2_ < auVar141._0_2_);
    auVar228._2_2_ = -(ushort)(auVar191._2_2_ < auVar141._2_2_);
    auVar228._4_2_ = -(ushort)(auVar191._4_2_ < auVar141._4_2_);
    auVar228._6_2_ = -(ushort)(auVar191._6_2_ < auVar141._6_2_);
    auVar228._8_2_ = -(ushort)(auVar191._8_2_ < auVar141._8_2_);
    auVar228._10_2_ = -(ushort)(auVar191._10_2_ < auVar141._10_2_);
    auVar228._12_2_ = -(ushort)(auVar191._12_2_ < auVar141._12_2_);
    auVar228._14_2_ = -(ushort)(auVar191._14_2_ < auVar141._14_2_);
    auVar161._0_2_ = -(ushort)(auVar178._0_2_ < auVar141._0_2_);
    auVar161._2_2_ = -(ushort)(auVar178._2_2_ < auVar141._2_2_);
    auVar161._4_2_ = -(ushort)(auVar178._4_2_ < auVar141._4_2_);
    auVar161._6_2_ = -(ushort)(auVar178._6_2_ < auVar141._6_2_);
    auVar161._8_2_ = -(ushort)(auVar178._8_2_ < auVar141._8_2_);
    auVar161._10_2_ = -(ushort)(auVar178._10_2_ < auVar141._10_2_);
    auVar161._12_2_ = -(ushort)(auVar178._12_2_ < auVar141._12_2_);
    auVar161._14_2_ = -(ushort)(auVar178._14_2_ < auVar141._14_2_);
    auVar221._0_2_ = -(ushort)(auVar178._0_2_ < auVar191._0_2_);
    auVar221._2_2_ = -(ushort)(auVar178._2_2_ < auVar191._2_2_);
    auVar221._4_2_ = -(ushort)(auVar178._4_2_ < auVar191._4_2_);
    auVar221._6_2_ = -(ushort)(auVar178._6_2_ < auVar191._6_2_);
    auVar221._8_2_ = -(ushort)(auVar178._8_2_ < auVar191._8_2_);
    auVar221._10_2_ = -(ushort)(auVar178._10_2_ < auVar191._10_2_);
    auVar221._12_2_ = -(ushort)(auVar178._12_2_ < auVar191._12_2_);
    auVar221._14_2_ = -(ushort)(auVar178._14_2_ < auVar191._14_2_);
    auVar58._4_2_ = sVar186;
    auVar58._0_4_ = uVar113;
    auVar58._6_2_ = sVar187;
    auVar58._8_2_ = sVar186;
    auVar58._10_2_ = sVar187;
    auVar58._12_2_ = sVar186;
    auVar58._14_2_ = sVar187;
    auVar191 = ~(auVar198 | auVar219) & auVar124 |
               (~auVar184 & auVar188 | auVar57 & auVar184) & (auVar198 | auVar219);
    auVar178 = ~(auVar161 | auVar228) & auVar124 |
               (~auVar221 & auVar159 | auVar58 & auVar221) & (auVar161 | auVar228);
    sVar121 = auVar191._0_2_;
    sVar125 = auVar191._2_2_;
    sVar126 = auVar191._4_2_;
    sVar127 = auVar191._6_2_;
    sVar128 = auVar191._8_2_;
    sVar131 = auVar191._10_2_;
    sVar134 = auVar191._12_2_;
    sVar137 = auVar191._14_2_;
    sVar28 = auVar178._0_2_;
    sVar32 = auVar178._2_2_;
    sVar36 = auVar178._4_2_;
    sVar40 = auVar178._6_2_;
    sVar44 = auVar178._8_2_;
    sVar48 = auVar178._10_2_;
    sVar52 = auVar178._12_2_;
    sVar56 = auVar178._14_2_;
    puVar112[-0x30] = (0 < sVar1) * (sVar1 < 0x100) * auVar201[0] - (0xff < sVar1);
    puVar112[-0x2f] = (0 < sVar4) * (sVar4 < 0x100) * auVar201[2] - (0xff < sVar4);
    puVar112[-0x2e] = (0 < sVar7) * (sVar7 < 0x100) * auVar201[4] - (0xff < sVar7);
    puVar112[-0x2d] = (0 < sVar10) * (sVar10 < 0x100) * auVar201[6] - (0xff < sVar10);
    puVar112[-0x2c] = (0 < sVar13) * (sVar13 < 0x100) * auVar201[8] - (0xff < sVar13);
    puVar112[-0x2b] = (0 < sVar16) * (sVar16 < 0x100) * auVar201[10] - (0xff < sVar16);
    puVar112[-0x2a] = (0 < sVar19) * (sVar19 < 0x100) * auVar201[0xc] - (0xff < sVar19);
    puVar112[-0x29] = (0 < sVar22) * (sVar22 < 0x100) * auVar201[0xe] - (0xff < sVar22);
    puVar112[-0x28] = (0 < sVar25) * (sVar25 < 0x100) * auVar203[0] - (0xff < sVar25);
    puVar112[-0x27] = (0 < sVar29) * (sVar29 < 0x100) * auVar203[2] - (0xff < sVar29);
    puVar112[-0x26] = (0 < sVar33) * (sVar33 < 0x100) * auVar203[4] - (0xff < sVar33);
    puVar112[-0x25] = (0 < sVar37) * (sVar37 < 0x100) * auVar203[6] - (0xff < sVar37);
    puVar112[-0x24] = (0 < sVar41) * (sVar41 < 0x100) * auVar203[8] - (0xff < sVar41);
    puVar112[-0x23] = (0 < sVar45) * (sVar45 < 0x100) * auVar203[10] - (0xff < sVar45);
    puVar112[-0x22] = (0 < sVar49) * (sVar49 < 0x100) * auVar203[0xc] - (0xff < sVar49);
    puVar112[-0x21] = (0 < sVar53) * (sVar53 < 0x100) * auVar203[0xe] - (0xff < sVar53);
    puVar112[-0x20] = (0 < sVar2) * (sVar2 < 0x100) * auVar213[0] - (0xff < sVar2);
    puVar112[-0x1f] = (0 < sVar5) * (sVar5 < 0x100) * auVar213[2] - (0xff < sVar5);
    puVar112[-0x1e] = (0 < sVar8) * (sVar8 < 0x100) * auVar213[4] - (0xff < sVar8);
    puVar112[-0x1d] = (0 < sVar11) * (sVar11 < 0x100) * auVar213[6] - (0xff < sVar11);
    puVar112[-0x1c] = (0 < sVar14) * (sVar14 < 0x100) * auVar213[8] - (0xff < sVar14);
    puVar112[-0x1b] = (0 < sVar17) * (sVar17 < 0x100) * auVar213[10] - (0xff < sVar17);
    puVar112[-0x1a] = (0 < sVar20) * (sVar20 < 0x100) * auVar213[0xc] - (0xff < sVar20);
    puVar112[-0x19] = (0 < sVar23) * (sVar23 < 0x100) * auVar213[0xe] - (0xff < sVar23);
    puVar112[-0x18] = (0 < sVar26) * (sVar26 < 0x100) * auVar217[0] - (0xff < sVar26);
    puVar112[-0x17] = (0 < sVar30) * (sVar30 < 0x100) * auVar217[2] - (0xff < sVar30);
    puVar112[-0x16] = (0 < sVar34) * (sVar34 < 0x100) * auVar217[4] - (0xff < sVar34);
    puVar112[-0x15] = (0 < sVar38) * (sVar38 < 0x100) * auVar217[6] - (0xff < sVar38);
    puVar112[-0x14] = (0 < sVar42) * (sVar42 < 0x100) * auVar217[8] - (0xff < sVar42);
    puVar112[-0x13] = (0 < sVar46) * (sVar46 < 0x100) * auVar217[10] - (0xff < sVar46);
    puVar112[-0x12] = (0 < sVar50) * (sVar50 < 0x100) * auVar217[0xc] - (0xff < sVar50);
    puVar112[-0x11] = (0 < sVar54) * (sVar54 < 0x100) * auVar217[0xe] - (0xff < sVar54);
    puVar112[-0x10] = (0 < sVar3) * (sVar3 < 0x100) * auVar225[0] - (0xff < sVar3);
    puVar112[-0xf] = (0 < sVar6) * (sVar6 < 0x100) * auVar225[2] - (0xff < sVar6);
    puVar112[-0xe] = (0 < sVar9) * (sVar9 < 0x100) * auVar225[4] - (0xff < sVar9);
    puVar112[-0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar225[6] - (0xff < sVar12);
    puVar112[-0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar225[8] - (0xff < sVar15);
    puVar112[-0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar225[10] - (0xff < sVar18);
    puVar112[-10] = (0 < sVar21) * (sVar21 < 0x100) * auVar225[0xc] - (0xff < sVar21);
    puVar112[-9] = (0 < sVar24) * (sVar24 < 0x100) * auVar225[0xe] - (0xff < sVar24);
    puVar112[-8] = (0 < sVar27) * (sVar27 < 0x100) * auVar227[0] - (0xff < sVar27);
    puVar112[-7] = (0 < sVar31) * (sVar31 < 0x100) * auVar227[2] - (0xff < sVar31);
    puVar112[-6] = (0 < sVar35) * (sVar35 < 0x100) * auVar227[4] - (0xff < sVar35);
    puVar112[-5] = (0 < sVar39) * (sVar39 < 0x100) * auVar227[6] - (0xff < sVar39);
    puVar112[-4] = (0 < sVar43) * (sVar43 < 0x100) * auVar227[8] - (0xff < sVar43);
    puVar112[-3] = (0 < sVar47) * (sVar47 < 0x100) * auVar227[10] - (0xff < sVar47);
    puVar112[-2] = (0 < sVar51) * (sVar51 < 0x100) * auVar227[0xc] - (0xff < sVar51);
    puVar112[-1] = (0 < sVar55) * (sVar55 < 0x100) * auVar227[0xe] - (0xff < sVar55);
    *puVar112 = (0 < sVar121) * (sVar121 < 0x100) * auVar191[0] - (0xff < sVar121);
    puVar112[1] = (0 < sVar125) * (sVar125 < 0x100) * auVar191[2] - (0xff < sVar125);
    puVar112[2] = (0 < sVar126) * (sVar126 < 0x100) * auVar191[4] - (0xff < sVar126);
    puVar112[3] = (0 < sVar127) * (sVar127 < 0x100) * auVar191[6] - (0xff < sVar127);
    puVar112[4] = (0 < sVar128) * (sVar128 < 0x100) * auVar191[8] - (0xff < sVar128);
    puVar112[5] = (0 < sVar131) * (sVar131 < 0x100) * auVar191[10] - (0xff < sVar131);
    puVar112[6] = (0 < sVar134) * (sVar134 < 0x100) * auVar191[0xc] - (0xff < sVar134);
    puVar112[7] = (0 < sVar137) * (sVar137 < 0x100) * auVar191[0xe] - (0xff < sVar137);
    puVar112[8] = (0 < sVar28) * (sVar28 < 0x100) * auVar178[0] - (0xff < sVar28);
    puVar112[9] = (0 < sVar32) * (sVar32 < 0x100) * auVar178[2] - (0xff < sVar32);
    puVar112[10] = (0 < sVar36) * (sVar36 < 0x100) * auVar178[4] - (0xff < sVar36);
    puVar112[0xb] = (0 < sVar40) * (sVar40 < 0x100) * auVar178[6] - (0xff < sVar40);
    puVar112[0xc] = (0 < sVar44) * (sVar44 < 0x100) * auVar178[8] - (0xff < sVar44);
    puVar112[0xd] = (0 < sVar48) * (sVar48 < 0x100) * auVar178[10] - (0xff < sVar48);
    puVar112[0xe] = (0 < sVar52) * (sVar52 < 0x100) * auVar178[0xc] - (0xff < sVar52);
    puVar112[0xf] = (0 < sVar56) * (sVar56 < 0x100) * auVar178[0xe] - (0xff < sVar56);
    auVar124._0_2_ = auVar120._0_2_ + 1;
    auVar124._2_2_ = auVar120._2_2_ + 1;
    auVar124._4_2_ = auVar120._4_2_ + 1;
    auVar124._6_2_ = auVar120._6_2_ + 1;
    auVar124._8_2_ = auVar120._8_2_ + 1;
    auVar124._10_2_ = auVar120._10_2_ + 1;
    auVar124._12_2_ = auVar120._12_2_ + 1;
    auVar124._14_2_ = auVar120._14_2_ + 1;
    puVar112 = puVar112 + stride;
    iVar111 = iVar111 + -1;
    auVar120 = auVar124;
  } while (iVar111 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  const __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
    const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
    const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}